

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O3

void __thiscall SQStringTable::Remove(SQStringTable *this,SQString *bs)

{
  long lVar1;
  ulong uVar2;
  SQString **ppSVar3;
  SQString *pSVar4;
  SQString *p;
  
  uVar2 = this->_numofslots - 1 & bs->_hash;
  p = this->_strings[uVar2];
  if (p == (SQString *)0x0) {
    return;
  }
  if (p == bs) {
    pSVar4 = (SQString *)0x0;
  }
  else {
    do {
      pSVar4 = p;
      p = pSVar4->_next;
      if (p == (SQString *)0x0) {
        return;
      }
    } while (p != bs);
  }
  ppSVar3 = &pSVar4->_next;
  if (pSVar4 == (SQString *)0x0) {
    ppSVar3 = this->_strings + uVar2;
  }
  *ppSVar3 = p->_next;
  this->_slotused = this->_slotused - 1;
  lVar1 = p->_len;
  (**(p->super_SQRefCounted)._vptr_SQRefCounted)(p);
  sq_vm_free(p,lVar1 + 0x40);
  return;
}

Assistant:

void SQStringTable::Remove(SQString *bs)
{
    SQString *s;
    SQString *prev=NULL;
    SQHash h = bs->_hash&(_numofslots - 1);

    for (s = _strings[h]; s; ){
        if(s == bs){
            if(prev)
                prev->_next = s->_next;
            else
                _strings[h] = s->_next;
            _slotused--;
            SQInteger slen = s->_len;
            s->~SQString();
            SQ_FREE(s,sizeof(SQString) + sq_rsl(slen));
            return;
        }
        prev = s;
        s = s->_next;
    }
    assert(0);//if this fail something is wrong
}